

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

cgltf_bool
cgltf_accessor_read_uint
          (cgltf_accessor *accessor,cgltf_size index,cgltf_uint *out,cgltf_size element_size)

{
  cgltf_component_type cVar1;
  cgltf_type type;
  cgltf_buffer_view *pcVar2;
  void *pvVar3;
  cgltf_size cVar4;
  cgltf_size cVar5;
  cgltf_size cVar6;
  long lVar7;
  cgltf_size cVar8;
  cgltf_bool cVar9;
  cgltf_uint cVar10;
  cgltf_uint *pcVar11;
  uint uVar12;
  
  cVar9 = 0;
  if (accessor->is_sparse == 0) {
    pcVar2 = accessor->buffer_view;
    if (pcVar2 == (cgltf_buffer_view *)0x0) {
      memset(out,0,element_size << 2);
      cVar9 = 1;
    }
    else {
      pvVar3 = pcVar2->buffer->data;
      if (pvVar3 != (void *)0x0) {
        cVar8 = accessor->stride;
        cVar4 = accessor->offset;
        cVar5 = pcVar2->offset;
        cVar1 = accessor->component_type;
        type = accessor->type;
        cVar6 = cgltf_num_components(type);
        cVar9 = 0;
        if (2 < type - cgltf_type_mat2 && cVar6 <= element_size) {
          uVar12 = cVar1 - cgltf_component_type_r_8;
          if (uVar12 < 6) {
            lVar7 = *(long *)(&DAT_001725b0 + (ulong)uVar12 * 8);
          }
          else {
            lVar7 = 0;
          }
          pcVar11 = (cgltf_uint *)((long)pvVar3 + index * cVar8 + cVar5 + cVar4);
          cVar9 = 1;
          for (cVar8 = 0; cVar6 != cVar8; cVar8 = cVar8 + 1) {
            switch(uVar12) {
            case 0:
              cVar10 = (cgltf_uint)(char)(byte)*pcVar11;
              break;
            case 1:
              cVar10 = (cgltf_uint)(byte)*pcVar11;
              break;
            case 2:
              cVar10 = (cgltf_uint)(short)(ushort)*pcVar11;
              break;
            case 3:
              cVar10 = (cgltf_uint)(ushort)*pcVar11;
              break;
            case 4:
              cVar10 = *pcVar11;
              break;
            default:
              cVar10 = 0;
            }
            out[cVar8] = cVar10;
            pcVar11 = (cgltf_uint *)((long)pcVar11 + lVar7);
          }
        }
      }
    }
  }
  return cVar9;
}

Assistant:

cgltf_bool cgltf_accessor_read_uint(const cgltf_accessor* accessor, cgltf_size index, cgltf_uint* out, cgltf_size element_size)
{
    if (accessor->is_sparse)
    {
        return 0;
    }
    if (accessor->buffer_view == NULL)
    {
        memset(out, 0, element_size * sizeof( cgltf_uint ));
        return 1;
    }
    if (accessor->buffer_view->buffer->data == NULL)
    {
        return 0;
    }
    cgltf_size offset = accessor->offset + accessor->buffer_view->offset;
    const uint8_t* element = (const uint8_t*) accessor->buffer_view->buffer->data;
    element += offset + accessor->stride * index;
    return cgltf_element_read_uint(element, accessor->type, accessor->component_type, out, element_size);
}